

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

Status __thiscall
leveldb::SetCurrentFile(leveldb *this,Env *env,string *dbname,uint64_t descriptor_number)

{
  bool bVar1;
  long lVar2;
  Status local_130;
  string local_128;
  Status local_108;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  Slice local_c0;
  undefined1 local_a9;
  undefined1 local_a8 [8];
  string tmp;
  Slice local_68;
  undefined1 local_58 [8];
  Slice contents;
  string manifest;
  uint64_t descriptor_number_local;
  string *dbname_local;
  Env *env_local;
  Status *s;
  
  DescriptorFileName((string *)&contents.size_,dbname,descriptor_number);
  Slice::Slice((Slice *)local_58,(string *)&contents.size_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tmp.field_2 + 8),dbname,"/");
  Slice::Slice(&local_68,(string *)((long)&tmp.field_2 + 8));
  bVar1 = Slice::starts_with((Slice *)local_58,&local_68);
  if (!bVar1) {
    __assert_fail("contents.starts_with(dbname + \"/\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/filename.cc"
                  ,0x80,"Status leveldb::SetCurrentFile(Env *, const std::string &, uint64_t)");
  }
  std::__cxx11::string::~string((string *)(tmp.field_2._M_local_buf + 8));
  lVar2 = std::__cxx11::string::size();
  Slice::remove_prefix((Slice *)local_58,lVar2 + 1);
  TempFileName((string *)local_a8,dbname,descriptor_number);
  local_a9 = 0;
  Slice::ToString_abi_cxx11_(&local_100,(Slice *)local_58);
  std::operator+(&local_e0,&local_100,"\n");
  Slice::Slice(&local_c0,&local_e0);
  WriteStringToFileSync(this,env,&local_c0,(string *)local_a8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    CurrentFileName(&local_128,dbname);
    (*env->_vptr_Env[0xe])(&local_108,env,local_a8,&local_128);
    Status::operator=((Status *)this,&local_108);
    Status::~Status(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
  }
  bVar1 = Status::ok((Status *)this);
  if (!bVar1) {
    (*env->_vptr_Env[8])(&local_130,env,local_a8);
    Status::~Status(&local_130);
  }
  local_a9 = 1;
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&contents.size_);
  return (Status)(char *)this;
}

Assistant:

Status SetCurrentFile(Env* env, const std::string& dbname,
                      uint64_t descriptor_number) {
  // Remove leading "dbname/" and add newline to manifest file name
  std::string manifest = DescriptorFileName(dbname, descriptor_number);
  Slice contents = manifest;
  assert(contents.starts_with(dbname + "/"));
  contents.remove_prefix(dbname.size() + 1);
  std::string tmp = TempFileName(dbname, descriptor_number);
  Status s = WriteStringToFileSync(env, contents.ToString() + "\n", tmp);
  if (s.ok()) {
    s = env->RenameFile(tmp, CurrentFileName(dbname));
  }
  if (!s.ok()) {
    env->RemoveFile(tmp);
  }
  return s;
}